

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O3

void av1_free_ref_frame_buffers(BufferPool *pool)

{
  undefined8 *puVar1;
  RefCntBuffer *pRVar2;
  ulong uVar3;
  long lVar4;
  
  if (pool->num_frame_bufs != '\0') {
    lVar4 = 0x4c8;
    uVar3 = 0;
    do {
      pRVar2 = pool->frame_bufs;
      if ((0 < *(int *)((long)pRVar2 + lVar4 + -0x4c8)) &&
         (*(long *)((long)pRVar2->ref_order_hints + lVar4 + -8) != 0)) {
        (*pool->release_fb_cb)
                  (pool->cb_priv,
                   (aom_codec_frame_buffer_t *)((long)pRVar2->ref_order_hints + lVar4 + -8));
        pRVar2 = pool->frame_bufs;
        *(undefined4 *)((long)pRVar2 + lVar4 + -0x4c8) = 0;
        puVar1 = (undefined8 *)((long)pRVar2->ref_order_hints + lVar4 + -8);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pRVar2->ref_order_hints + lVar4 + 8) = 0;
      }
      aom_free(*(void **)((long)pRVar2 + lVar4 + -0x480));
      pRVar2 = pool->frame_bufs;
      *(undefined8 *)((long)pRVar2 + lVar4 + -0x480) = 0;
      aom_free(*(void **)((long)pRVar2 + lVar4 + -0x478));
      pRVar2 = pool->frame_bufs;
      *(undefined8 *)((long)pRVar2 + lVar4 + -0x478) = 0;
      aom_free_frame_buffer((YV12_BUFFER_CONFIG *)((long)pRVar2->ref_order_hints + lVar4 + 0x10));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x58e0;
    } while (uVar3 < pool->num_frame_bufs);
  }
  aom_free(pool->frame_bufs);
  pool->frame_bufs = (RefCntBuffer *)0x0;
  pool->num_frame_bufs = '\0';
  return;
}

Assistant:

void av1_free_ref_frame_buffers(BufferPool *pool) {
  int i;

  for (i = 0; i < pool->num_frame_bufs; ++i) {
    if (pool->frame_bufs[i].ref_count > 0 &&
        pool->frame_bufs[i].raw_frame_buffer.data != NULL) {
      pool->release_fb_cb(pool->cb_priv, &pool->frame_bufs[i].raw_frame_buffer);
      pool->frame_bufs[i].raw_frame_buffer.data = NULL;
      pool->frame_bufs[i].raw_frame_buffer.size = 0;
      pool->frame_bufs[i].raw_frame_buffer.priv = NULL;
      pool->frame_bufs[i].ref_count = 0;
    }
    aom_free(pool->frame_bufs[i].mvs);
    pool->frame_bufs[i].mvs = NULL;
    aom_free(pool->frame_bufs[i].seg_map);
    pool->frame_bufs[i].seg_map = NULL;
    aom_free_frame_buffer(&pool->frame_bufs[i].buf);
  }
  aom_free(pool->frame_bufs);
  pool->frame_bufs = NULL;
  pool->num_frame_bufs = 0;
}